

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O3

int tconcat(lua_State *L)

{
  TValue *pTVar1;
  uint i;
  char *s;
  ulong uVar2;
  size_t sVar4;
  uint uVar5;
  size_t lsep;
  size_t local_2048;
  luaL_Buffer local_2040;
  lua_Integer lVar3;
  
  s = luaL_optlstring(L,2,"",&local_2048);
  luaL_checktype(L,1,5);
  uVar2 = luaL_optinteger(L,3,1);
  pTVar1 = L->base + 3;
  if ((pTVar1 == &luaO_nilobject_ || L->top <= pTVar1) || (L->base[3].tt < 1)) {
    sVar4 = lua_objlen(L,1);
    i = (uint)sVar4;
  }
  else {
    lVar3 = luaL_checkinteger(L,4);
    i = (uint)lVar3;
  }
  local_2040.p = local_2040.buffer;
  local_2040.lvl = 0;
  local_2040.L = L;
  if ((int)(uint)uVar2 < (int)i) {
    do {
      addfield(L,&local_2040,(int)uVar2);
      luaL_addlstring(&local_2040,s,local_2048);
      uVar5 = (int)uVar2 + 1;
      uVar2 = (ulong)uVar5;
    } while (i != uVar5);
  }
  else if ((uint)uVar2 != i) goto LAB_0011088d;
  addfield(L,&local_2040,i);
LAB_0011088d:
  emptybuffer(&local_2040);
  lua_concat(local_2040.L,local_2040.lvl);
  return 1;
}

Assistant:

static int tconcat(lua_State*L){
luaL_Buffer b;
size_t lsep;
int i,last;
const char*sep=luaL_optlstring(L,2,"",&lsep);
luaL_checktype(L,1,5);
i=luaL_optint(L,3,1);
last=luaL_opt(L,luaL_checkint,4,luaL_getn(L,1));
luaL_buffinit(L,&b);
for(;i<last;i++){
addfield(L,&b,i);
luaL_addlstring(&b,sep,lsep);
}
if(i==last)
addfield(L,&b,i);
luaL_pushresult(&b);
return 1;
}